

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonGroupInverse(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  long lVar1;
  bool bVar2;
  void *pvVar3;
  bool bVar4;
  JsonString *pStr;
  char c;
  char *z;
  int nNest;
  int inStr;
  uint i;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  bVar2 = false;
  z._4_4_ = 0;
  pvVar3 = sqlite3_aggregate_context(ctx,0);
  if (pvVar3 != (void *)0x0) {
    lVar1 = *(long *)((long)pvVar3 + 8);
    nNest = 1;
    while( true ) {
      bVar4 = false;
      if ((ulong)(uint)nNest < *(ulong *)((long)pvVar3 + 0x18)) {
        pStr._7_1_ = *(char *)(lVar1 + (ulong)(uint)nNest);
        bVar4 = true;
        if ((pStr._7_1_ == ',') && (bVar4 = true, !bVar2)) {
          bVar4 = z._4_4_ != 0;
        }
      }
      if (!bVar4) break;
      if (pStr._7_1_ == '\"') {
        bVar2 = (bool)(bVar2 ^ 1);
      }
      else if (pStr._7_1_ == '\\') {
        nNest = nNest + 1;
      }
      else if (!bVar2) {
        if ((pStr._7_1_ == '{') || (pStr._7_1_ == '[')) {
          z._4_4_ = z._4_4_ + 1;
        }
        if ((pStr._7_1_ == '}') || (pStr._7_1_ == ']')) {
          z._4_4_ = z._4_4_ + -1;
        }
      }
      nNest = nNest + 1;
    }
    if ((ulong)(uint)nNest < *(ulong *)((long)pvVar3 + 0x18)) {
      *(ulong *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) - (ulong)(uint)nNest;
      memmove((void *)(lVar1 + 1),(void *)(lVar1 + (ulong)(nNest + 1)),
              *(long *)((long)pvVar3 + 0x18) - 1);
      *(undefined1 *)(lVar1 + *(long *)((long)pvVar3 + 0x18)) = 0;
    }
    else {
      *(undefined8 *)((long)pvVar3 + 0x18) = 1;
    }
  }
  return;
}

Assistant:

static void jsonGroupInverse(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  unsigned int i;
  int inStr = 0;
  int nNest = 0;
  char *z;
  char c;
  JsonString *pStr;
  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(argv);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, 0);
#ifdef NEVER
  /* pStr is always non-NULL since jsonArrayStep() or jsonObjectStep() will
  ** always have been called to initalize it */
  if( NEVER(!pStr) ) return;
#endif
  z = pStr->zBuf;
  for(i=1; i<pStr->nUsed && ((c = z[i])!=',' || inStr || nNest); i++){
    if( c=='"' ){
      inStr = !inStr;
    }else if( c=='\\' ){
      i++;
    }else if( !inStr ){
      if( c=='{' || c=='[' ) nNest++;
      if( c=='}' || c==']' ) nNest--;
    }
  }
  if( i<pStr->nUsed ){
    pStr->nUsed -= i;
    memmove(&z[1], &z[i+1], (size_t)pStr->nUsed-1);
    z[pStr->nUsed] = 0;
  }else{
    pStr->nUsed = 1;
  }
}